

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.cpp
# Opt level: O1

bool __thiscall duckdb::LineReader::NextLine(LineReader *this)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  byte unaff_BPL;
  byte bVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  
  uVar7 = 0;
  do {
    uVar5 = this->position;
    uVar6 = this->capacity;
    uVar3 = uVar5;
    uVar2 = uVar5;
    if (uVar5 < uVar6) {
      do {
        uVar3 = uVar2;
        if ((this->data_buffer[uVar2] == '\n') || (this->data_buffer[uVar2] == '\r')) break;
        uVar2 = uVar2 + 1;
        uVar3 = uVar6;
      } while (uVar6 != uVar2);
    }
    if (uVar3 < uVar6) {
      uVar6 = uVar3;
    }
    uVar3 = (uVar6 - uVar5) + uVar7;
    bVar4 = unaff_BPL;
    if (uVar3 < 0x32001) {
      switchD_00b1522a::default(this->line_buffer + uVar7,this->data_buffer + uVar5,uVar6 - uVar5);
      uVar7 = uVar3;
      if (uVar6 < this->capacity) {
        *(undefined1 *)((long)this + uVar3 + 0x10) = 0;
        this->position = uVar6 + 1;
        if (this->data_buffer[uVar6] == '\r') {
          SkipNewline(this);
        }
        bVar8 = false;
        if ((uVar3 == 0) || (bVar1 = Utf8Proc::IsValid(this->line_buffer,uVar3), !bVar1)) {
          uVar7 = 0;
        }
        else {
          bVar8 = true;
          bVar4 = 1;
        }
      }
      else {
        FillBuffer(this);
        bVar8 = this->capacity == 0;
        bVar4 = uVar3 != 0;
        if (!bVar8) {
          bVar4 = unaff_BPL;
        }
      }
    }
    else {
      bVar8 = false;
      while (uVar5 = this->capacity, uVar5 != 0) {
        uVar6 = this->position;
        uVar3 = uVar6;
        if (uVar6 < uVar5) {
          do {
            uVar3 = uVar6;
            if ((this->data_buffer[uVar6] == '\n') || (this->data_buffer[uVar6] == '\r')) break;
            uVar6 = uVar6 + 1;
            uVar3 = uVar5;
          } while (uVar5 != uVar6);
        }
        if (uVar3 < uVar5) {
          bVar8 = true;
        }
        if (bVar8) {
          if (uVar3 < uVar5) {
            uVar5 = uVar3;
          }
          this->position = uVar5 + 1;
          bVar8 = false;
          if (this->data_buffer[uVar5] == '\r') {
            SkipNewline(this);
          }
          goto LAB_002202b9;
        }
        FillBuffer(this);
      }
      bVar8 = true;
      bVar4 = 0;
    }
LAB_002202b9:
    unaff_BPL = bVar4;
    if (bVar8) {
      return (bool)(bVar4 & 1);
    }
  } while( true );
}

Assistant:

bool NextLine() {
		idx_t line_size = 0;
		while (true) {
			// find the next newline in the current buffer (if any)
			idx_t i = GetNextNewline();
			// copy over the data and move to the next byte
			idx_t read_count = i - position;
			if (line_size + read_count > LINENOISE_MAX_LINE) {
				// exceeded max line size
				// move on to next line and don't add to history
				// skip to next newline
				bool found_next_newline = false;
				while (!found_next_newline && capacity > 0) {
					i = GetNextNewline();
					if (i < capacity) {
						found_next_newline = true;
					}
					if (!found_next_newline) {
						// read more data
						FillBuffer();
					}
				}
				if (!found_next_newline) {
					// no newline found - skip
					return false;
				}
				// newline found - adjust position and read next line
				position = i + 1;
				if (data_buffer[i] == '\r') {
					// \r\n - skip the next byte as well
					SkipNewline();
				}
				continue;
			}
			memcpy(line_buffer + line_size, data_buffer + position, read_count);
			line_size += read_count;

			if (i < capacity) {
				// we're still within the buffer - this means we found a newline in the buffer
				line_buffer[line_size] = '\0';
				position = i + 1;
				if (data_buffer[i] == '\r') {
					// \r\n - skip the next byte as well
					SkipNewline();
				}
				if (line_size == 0 || !Utf8Proc::IsValid(line_buffer, line_size)) {
					// line is empty OR not valid UTF8
					// move on to next line and don't add to history
					line_size = 0;
					continue;
				}
				return true;
			}
			// we need to read more data - fill up the buffer
			FillBuffer();
			if (capacity == 0) {
				// no more data available - return true if there is anything we copied over (i.e. part of the next line)
				return line_size > 0;
			}
		}
	}